

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

BYTE * __thiscall FHealthBar::GetColumn(FHealthBar *this,uint column,Span **spans_out)

{
  Span **spans_out_local;
  uint column_local;
  FHealthBar *this_local;
  
  if ((this->NeedRefresh & 1U) != 0) {
    MakeTexture(this);
  }
  spans_out_local._4_4_ = column;
  if (199 < column) {
    spans_out_local._4_4_ = 199;
  }
  if (spans_out != (Span **)0x0) {
    *spans_out = DummySpan + ((uint)(this->VialLevel << 1) <= spans_out_local._4_4_);
  }
  return &(this->super_FTexture).field_0x54 + (spans_out_local._4_4_ << 1);
}

Assistant:

const BYTE *FHealthBar::GetColumn (unsigned int column, const Span **spans_out)
{
	if (NeedRefresh)
	{
		MakeTexture ();
	}
	if (column > 199)
	{
		column = 199;
	}
	if (spans_out != NULL)
	{
		*spans_out = &DummySpan[column >= (unsigned int)VialLevel*2];
	}
	return Pixels + column*2;
}